

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

carrier_uint
fmt::v11::detail::dragonbox::cache_accessor<double>::
compute_right_endpoint_for_shorter_interval_case(cache_entry_type *cache,int beta)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  char in_SIL;
  uint128_fallback *in_RDI;
  
  uVar3 = uint128_fallback::high(in_RDI);
  uVar4 = uint128_fallback::high(in_RDI);
  iVar1 = num_significand_bits<double>();
  iVar2 = num_significand_bits<double>();
  return uVar3 + (uVar4 >> ((char)iVar1 + 1U & 0x3f)) >> (('?' - (char)iVar2) - in_SIL & 0x3fU);
}

Assistant:

static auto compute_right_endpoint_for_shorter_interval_case(
      const cache_entry_type& cache, int beta) noexcept -> carrier_uint {
    return (cache.high() +
            (cache.high() >> (num_significand_bits<double>() + 1))) >>
           (64 - num_significand_bits<double>() - 1 - beta);
  }